

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O1

Fl_Widget * __thiscall Fl_Table_Type::enter_live_mode(Fl_Table_Type *this,int param_1)

{
  Fl_Widget *pFVar1;
  Fluid_Table *this_00;
  
  this_00 = (Fluid_Table *)operator_new(0x330);
  pFVar1 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  Fluid_Table::Fluid_Table(this_00,pFVar1->x_,pFVar1->y_,pFVar1->w_,pFVar1->h_,(char *)0x0);
  (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget = (Fl_Widget *)this_00;
  (*(this->super_Fl_Group_Type).super_Fl_Widget_Type.super_Fl_Type._vptr_Fl_Type[0x15])(this);
  Fl_Group::end((Fl_Group *)this_00);
  return (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget;
}

Assistant:

Fl_Widget *Fl_Table_Type::enter_live_mode(int) {
  Fl_Group *grp = new Fluid_Table(o->x(), o->y(), o->w(), o->h());
  live_widget = grp;
  if (live_widget) {
    copy_properties();
    grp->end();
  }
  return live_widget;
}